

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O3

void __thiscall
amrex::InterpBndryData::BndryValuesDoIt
          (InterpBndryData *this,BndryRegister *crse,int c_start,MultiFab *fine,int f_start,
          int bnd_start,int num_comp,IntVect *ratio,BCRec *bc,int max_order)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Box *pBVar6;
  FArrayBox *pFVar7;
  FArrayBox *pFVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [12];
  Box *pBVar14;
  IntVect *pIVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  pointer *ppbVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  int iVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  ulong uVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  uint uVar55;
  ulong uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  long lVar60;
  int iVar61;
  uint uVar62;
  int iVar63;
  int iVar64;
  long lVar65;
  int iVar66;
  ulong uVar67;
  int iVar68;
  uint uVar69;
  bool bVar70;
  uint uVar72;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar71 [16];
  double dVar73;
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar78;
  undefined1 auVar77 [16];
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  Array4<double> crse_array;
  Array4<double> bdry_array;
  Array4<int> mask_array;
  MFIter mfi;
  MultiFab foo;
  long local_548;
  int local_534;
  long local_530;
  long local_528;
  long local_520;
  long local_518;
  int local_50c;
  long local_500;
  long local_4f8;
  int local_4e4;
  ulong local_4c8;
  long local_4c0;
  ulong local_4b8;
  long local_4b0;
  long local_438;
  ulong local_350;
  Array4<double> local_348;
  Array4<double> local_308;
  MultiFab *local_2c8;
  BndryRegister *local_2c0;
  FabSet *local_2b8;
  Array4<int> local_2b0;
  long local_270;
  Box *local_268;
  Box *local_260;
  IntVect *local_258;
  long local_250;
  undefined1 local_248 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  int local_220;
  Vector<int,_std::allocator<int>_> *local_210;
  Vector<int,_std::allocator<int>_> *local_208;
  Box local_1e0;
  MFItInfo local_1c4;
  MultiFab local_1b0;
  
  uVar44 = (ulong)(uint)bnd_start;
  uVar19 = (ulong)(uint)num_comp;
  local_2c8 = fine;
  local_2c0 = crse;
  if ((bc != (BCRec *)0x0) && (0 < num_comp)) {
    do {
      (*(this->super_BndryData).super_BndryRegister._vptr_BndryRegister[3])(this,bc,ratio,uVar44);
      uVar33 = (int)uVar44 + 1;
      uVar44 = (ulong)uVar33;
    } while ((int)uVar33 < num_comp + bnd_start);
  }
  local_258 = ratio;
  if ((max_order | 2U) == 3) {
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248 = (undefined1  [16])0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348.p = (double *)&PTR__FabFactory_00712918;
    MultiFab::MultiFab(&local_1b0,&(this->super_BndryData).super_BndryRegister.grids,
                       &(this->super_BndryData).super_BndryRegister.bndry[0].m_mf.
                        super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap,1,0,
                       (MFInfo *)local_248,(FabFactory<amrex::FArrayBox> *)&local_348);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
    local_1c4.do_tiling = false;
    local_1c4.dynamic = true;
    local_1c4.device_sync = true;
    local_1c4.num_streams = Gpu::Device::max_gpu_streams;
    local_1c4.tilesize.vect[0] = 0;
    local_1c4.tilesize.vect[1] = 0;
    local_1c4.tilesize.vect[2] = 0;
    MFIter::MFIter((MFIter *)local_248,(FabArrayBase *)&local_1b0,&local_1c4);
    if ((int)local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage < local_220) {
      local_260 = &(this->super_BndryData).geom.domain;
      local_2b8 = (this->super_BndryData).super_BndryRegister.bndry;
      local_268 = (Box *)&(this->super_BndryData).geom.domain.bigend;
      local_2c0 = (BndryRegister *)local_2c0->bndry;
      local_250 = (long)bnd_start;
      lVar37 = (long)c_start;
      local_270 = (long)f_start << 3;
      lVar1 = local_250 * 8;
      do {
        BATransformer::operator()
                  (&local_1e0,(BATransformer *)(local_248._8_8_ + 8),
                   (Box *)((long)(local_210->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start
                                 [(int)local_238.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage] * 0x1c +
                          *(long *)&(((((BoxArray *)(local_248._8_8_ + 8))->m_ref).
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        uVar44 = 0;
        do {
          pIVar15 = local_258;
          uVar33 = (uint)uVar44;
          bVar22 = (char)uVar44 + (char)((uVar33 & 0xff) / 3) * -3;
          bVar70 = 2 < uVar44;
          uVar32 = uVar33 - 3;
          if (!bVar70) {
            uVar32 = uVar33;
          }
          pBVar14 = &local_1e0;
          if (bVar70) {
            pBVar14 = (Box *)&local_1e0.bigend;
          }
          pBVar6 = local_268;
          if (!bVar70) {
            pBVar6 = local_260;
          }
          if (((pBVar14->smallend).vect[bVar22] == (pBVar6->smallend).vect[bVar22]) &&
             (*(char *)((long)(this->super_BndryData).geom.super_CoordSys.inv_dx +
                       (long)(int)uVar32 + 0x19) != '\x01')) {
            if (local_2c8 != (MultiFab *)0x0) {
              ppbVar21 = &local_238.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (local_208 != (Vector<int,_std::allocator<int>_> *)0x0) {
                ppbVar21 = (pointer *)
                           ((local_208->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                           (int)local_238.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              if (0 < num_comp) {
                pFVar7 = local_2b8[uVar44].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar21];
                pFVar8 = (local_2c8->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar21];
                iVar63 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
                lVar43 = (long)iVar63;
                iVar3 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[1];
                lVar46 = (long)iVar3;
                iVar4 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[2];
                lVar26 = (long)iVar4;
                iVar17 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[0];
                iVar64 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[1];
                iVar61 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[2];
                iVar66 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[0];
                lVar28 = (long)iVar66;
                iVar36 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[1];
                lVar30 = (long)iVar36;
                iVar68 = (pFVar8->super_BaseFab<double>).domain.bigend.vect[0];
                iVar48 = (pFVar8->super_BaseFab<double>).domain.bigend.vect[1];
                iVar49 = (pFVar8->super_BaseFab<double>).domain.smallend.vect[2];
                lVar31 = (long)iVar49;
                iVar5 = (pFVar8->super_BaseFab<double>).domain.bigend.vect[2];
                iVar9 = iVar5;
                if (iVar61 < iVar5) {
                  iVar9 = iVar61;
                }
                iVar10 = iVar48;
                if (iVar64 < iVar48) {
                  iVar10 = iVar64;
                }
                iVar11 = iVar68;
                if (iVar17 < iVar68) {
                  iVar11 = iVar17;
                }
                iVar24 = iVar49;
                if (iVar49 < iVar4) {
                  iVar24 = iVar4;
                }
                iVar12 = iVar36;
                if (iVar36 < iVar3) {
                  iVar12 = iVar3;
                }
                iVar45 = iVar66;
                if (iVar66 < iVar63) {
                  iVar45 = iVar63;
                }
                lVar35 = lVar43;
                if (lVar43 < lVar28) {
                  lVar35 = lVar28;
                }
                lVar42 = lVar46;
                if (lVar46 < lVar30) {
                  lVar42 = lVar30;
                }
                lVar52 = lVar26;
                if (lVar26 < lVar31) {
                  lVar52 = lVar31;
                }
                lVar20 = (long)((iVar5 - iVar49) + 1);
                lVar27 = (long)((iVar48 - iVar36) + 1);
                lVar60 = (long)((iVar68 - iVar66) + 1);
                local_500 = ((local_270 * lVar20 + lVar52 * 8 + lVar31 * -8) * lVar27 + lVar42 * 8 +
                            lVar30 * -8) * lVar60 + lVar35 * 8 + lVar28 * -8 +
                            (long)(pFVar8->super_BaseFab<double>).dptr;
                lVar30 = (long)((iVar61 - iVar4) + 1);
                lVar28 = (long)((iVar64 - iVar3) + 1);
                lVar31 = (long)((iVar17 - iVar63) + 1);
                local_518 = ((lVar1 * lVar30 + lVar52 * 8 + lVar26 * -8) * lVar28 + lVar42 * 8 +
                            lVar46 * -8) * lVar31 + lVar35 * 8 + lVar43 * -8 +
                            (long)(pFVar7->super_BaseFab<double>).dptr;
                lVar43 = lVar27 * lVar60 * 8;
                lVar46 = lVar28 * lVar31 * 8;
                uVar41 = 0;
                do {
                  lVar28 = local_518;
                  lVar26 = local_500;
                  lVar35 = lVar52;
                  if (iVar24 <= iVar9) {
                    do {
                      lVar27 = lVar28;
                      lVar38 = lVar26;
                      lVar53 = lVar42;
                      if (iVar12 <= iVar10) {
                        do {
                          if (iVar45 <= iVar11) {
                            lVar54 = 0;
                            do {
                              *(undefined8 *)(lVar27 + lVar54 * 8) =
                                   *(undefined8 *)(lVar38 + lVar54 * 8);
                              lVar54 = lVar54 + 1;
                            } while ((iVar11 - iVar45) + 1 != (int)lVar54);
                          }
                          lVar53 = lVar53 + 1;
                          lVar38 = lVar38 + lVar60 * 8;
                          lVar27 = lVar27 + lVar31 * 8;
                        } while (((iVar10 + (int)lVar42) - iVar12) + 1 != (int)lVar53);
                      }
                      lVar35 = lVar35 + 1;
                      lVar28 = lVar28 + lVar46;
                      lVar26 = lVar26 + lVar43;
                    } while (((iVar9 + (int)lVar52) - iVar24) + 1 != (int)lVar35);
                  }
                  uVar41 = uVar41 + 1;
                  local_500 = local_500 + lVar20 * lVar43;
                  local_518 = local_518 + lVar30 * lVar46;
                } while (uVar41 != uVar19);
              }
            }
          }
          else {
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_348,
                       (FabArray<amrex::FArrayBox> *)
                       &local_2c0->bndry[uVar44 - 1].m_mf.super_FabArray<amrex::FArrayBox>.os_temp,
                       (MFIter *)local_248);
            this_00 = (FabArray<amrex::FArrayBox> *)(local_2b8 + uVar44);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_308,this_00,(MFIter *)local_248);
            ppbVar21 = &local_238.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_208 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar21 = (pointer *)
                         ((local_208->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         (int)local_238.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            pFVar7 = (this_00->m_fabs_v).
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar21];
            uVar33 = pIVar15->vect[0];
            uVar41 = *(ulong *)(pIVar15->vect + 1);
            iVar63 = (int)uVar41;
            uVar72 = (uint)(uVar41 >> 0x20);
            if (max_order == 1) {
              if (0 < num_comp) {
                uVar32 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[2];
                uVar2 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[2];
                iVar3 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[0];
                iVar4 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[1];
                iVar17 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[1];
                iVar64 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
                local_4b8 = 0;
                do {
                  if ((int)uVar32 <= (int)uVar2) {
                    uVar23 = uVar32;
                    do {
                      if (iVar17 <= iVar4) {
                        uVar41 = (long)iVar17;
                        do {
                          if (iVar64 <= iVar3) {
                            uVar39 = (uint)uVar41;
                            uVar51 = (long)iVar64;
                            do {
                              uVar55 = (uint)uVar51;
                              if (uVar33 != 1) {
                                if (uVar33 == 4) {
                                  if ((long)uVar51 < 0) {
                                    uVar55 = (int)uVar55 >> 2;
                                  }
                                  else {
                                    uVar55 = uVar55 >> 2;
                                  }
                                }
                                else if (uVar33 == 2) {
                                  if ((long)uVar51 < 0) {
                                    uVar55 = (int)uVar55 >> 1;
                                  }
                                  else {
                                    uVar55 = uVar55 >> 1;
                                  }
                                }
                                else if ((long)uVar51 < 0) {
                                  uVar55 = ~((int)~uVar55 / (int)uVar33);
                                }
                                else {
                                  uVar55 = (uint)((long)((ulong)(uint)((int)uVar55 >> 0x1f) << 0x20
                                                        | uVar51 & 0xffffffff) / (long)(int)uVar33);
                                }
                              }
                              uVar57 = uVar39;
                              if (((iVar63 != 1) && (uVar57 = (int)uVar39 >> 2, iVar63 != 4)) &&
                                 (uVar57 = (int)uVar39 >> 1, iVar63 != 2)) {
                                if ((long)uVar41 < 0) {
                                  uVar57 = ~((int)~uVar39 / iVar63);
                                }
                                else {
                                  uVar57 = (uint)((long)((ulong)(uint)((int)uVar39 >> 0x1f) << 0x20
                                                        | uVar41 & 0xffffffff) / (long)iVar63);
                                }
                              }
                              uVar16 = uVar23;
                              if (((uVar72 != 1) && (uVar16 = (int)uVar23 >> 2, uVar72 != 4)) &&
                                 (uVar16 = (int)uVar23 >> 1, uVar72 != 2)) {
                                if ((int)uVar23 < 0) {
                                  uVar16 = ~((int)~uVar23 / (int)uVar72);
                                }
                                else {
                                  uVar16 = (int)uVar23 / (int)uVar72;
                                }
                              }
                              local_308.p
                              [((long)(int)uVar23 - (long)local_308.begin.z) * local_308.kstride +
                               local_308.nstride * (local_250 + local_4b8) +
                               (uVar41 - (long)local_308.begin.y) * local_308.jstride +
                               (uVar51 - (long)local_308.begin.x)] =
                                   (double)local_348.p
                                           [((long)(int)uVar57 - (long)local_348.begin.y) *
                                            local_348.jstride +
                                            ((long)(int)uVar55 - (long)local_348.begin.x) +
                                            ((long)(int)uVar16 - (long)local_348.begin.z) *
                                            local_348.kstride +
                                            local_348.nstride * (lVar37 + local_4b8)];
                              uVar51 = uVar51 + 1;
                            } while ((int)uVar51 != iVar3 + 1);
                          }
                          uVar41 = uVar41 + 1;
                        } while (iVar4 + 1 != (int)uVar41);
                      }
                      bVar70 = uVar23 != uVar2;
                      uVar23 = uVar23 + 1;
                    } while (bVar70);
                  }
                  local_4b8 = local_4b8 + 1;
                } while (local_4b8 != uVar19);
              }
            }
            else {
              FabArray<amrex::Mask>::array<amrex::Mask,_0>
                        (&local_2b0,
                         &(this->super_BndryData).masks.
                          super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
                          super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar44].m_fa,(MFIter *)local_248)
              ;
              if (uVar32 == 2) {
                if (0 < num_comp) {
                  uVar32 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[2];
                  uVar2 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[2];
                  iVar3 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[1];
                  uVar23 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
                  uVar39 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[0];
                  iVar4 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[1];
                  lVar46 = (long)(int)uVar23;
                  local_350 = 0;
                  local_438 = lVar1;
                  do {
                    if ((int)uVar32 <= (int)uVar2) {
                      uVar55 = uVar32;
                      do {
                        if (iVar4 <= iVar3) {
                          lVar30 = ((long)(int)uVar55 - (long)local_2b0.begin.z) * local_2b0.kstride
                          ;
                          lVar28 = local_348.nstride * (lVar37 + local_350);
                          local_530 = (long)local_308.p +
                                      local_308.nstride * local_438 +
                                      ((long)iVar4 - (long)local_308.begin.y) *
                                      local_308.jstride * 8 +
                                      ((long)(int)uVar55 - (long)local_308.begin.z) *
                                      local_308.kstride * 8 + (long)local_308.begin.x * -8 +
                                      lVar46 * 8;
                          lVar43 = lVar30 * 4 + (long)local_2b0.begin.x * -4 + lVar46 * 4;
                          local_534 = iVar4 - (local_2b0.begin.y + iVar63);
                          iVar17 = (iVar4 + iVar63) - local_2b0.begin.y;
                          uVar41 = (long)iVar4;
                          do {
                            if ((int)uVar23 <= (int)uVar39) {
                              uVar16 = (uint)uVar41;
                              lVar26 = (uVar41 - (long)local_2b0.begin.y) * local_2b0.jstride;
                              lVar31 = (int)(uVar16 - (local_2b0.begin.y + iVar63)) *
                                       local_2b0.jstride;
                              lVar35 = (int)((uVar16 + iVar63) - local_2b0.begin.y) *
                                       local_2b0.jstride;
                              lVar42 = 0;
                              uVar57 = ~uVar23;
                              do {
                                lVar52 = lVar46 + lVar42;
                                uVar58 = (uint)((ulong)uVar23 + lVar42);
                                if (uVar33 == 4) {
                                  if (lVar52 < 0) {
                                    uVar58 = (int)uVar58 >> 2;
                                  }
                                  else {
                                    uVar58 = uVar58 >> 2;
                                  }
                                }
                                else if (uVar33 == 2) {
                                  if (lVar52 < 0) {
                                    uVar58 = (int)uVar58 >> 1;
                                  }
                                  else {
                                    uVar58 = uVar58 >> 1;
                                  }
                                }
                                else if (uVar33 != 1) {
                                  if (lVar52 < 0) {
                                    uVar58 = ~((int)uVar57 / (int)uVar33);
                                  }
                                  else {
                                    uVar58 = (uint)((long)((ulong)(uint)((int)uVar58 >> 0x1f) <<
                                                           0x20 | (ulong)uVar23 + lVar42 &
                                                                  0xffffffff) / (long)(int)uVar33);
                                  }
                                }
                                uVar34 = uVar16;
                                if (((iVar63 != 1) && (uVar34 = (int)uVar16 >> 2, iVar63 != 4)) &&
                                   (uVar34 = (int)uVar16 >> 1, iVar63 != 2)) {
                                  if ((long)uVar41 < 0) {
                                    uVar34 = ~((int)~uVar16 / iVar63);
                                  }
                                  else {
                                    uVar34 = (uint)((long)((ulong)(uint)((int)uVar16 >> 0x1f) <<
                                                           0x20 | uVar41 & 0xffffffff) /
                                                   (long)iVar63);
                                  }
                                }
                                uVar18 = uVar55;
                                if (((uVar72 != 1) && (uVar18 = (int)uVar55 >> 2, uVar72 != 4)) &&
                                   (uVar18 = (int)uVar55 >> 1, uVar72 != 2)) {
                                  if ((int)uVar55 < 0) {
                                    uVar18 = ~((int)~uVar55 / (int)uVar72);
                                  }
                                  else {
                                    uVar18 = (int)uVar55 / (int)uVar72;
                                  }
                                }
                                iVar64 = (int)lVar42;
                                lVar52 = (long)(int)((uVar23 - (uVar33 + local_2b0.begin.x)) +
                                                    iVar64);
                                uVar50 = uVar58 - 1;
                                uVar62 = uVar58;
                                if (local_2b0.p[lVar30 + lVar26 + lVar52] == 1) {
                                  uVar62 = uVar50;
                                }
                                lVar20 = (long)(int)(((uVar23 + uVar33) - local_2b0.begin.x) +
                                                    iVar64);
                                uVar59 = uVar58 + 1;
                                uVar69 = uVar58;
                                if (local_2b0.p[lVar30 + lVar26 + lVar20] == 1) {
                                  uVar69 = uVar59;
                                }
                                lVar27 = (int)(uVar34 - local_348.begin.y) * local_348.jstride;
                                lVar60 = ((long)(int)uVar18 - (long)local_348.begin.z) *
                                         local_348.kstride;
                                if (uVar69 == uVar62 + 2) {
                                  lVar38 = (long)(int)(uVar58 - local_348.begin.x);
                                  dVar73 = (((double)local_348.p
                                                     [lVar27 + (long)(int)(uVar59 - local_348.begin.
                                                                                    x) +
                                                               lVar60 + lVar28] -
                                            (local_348.p[lVar27 + lVar38 + lVar60 + lVar28] +
                                            (double)local_348.p[lVar27 + lVar38 + lVar60 + lVar28]))
                                           + (double)local_348.p
                                                     [lVar27 + (long)(int)(uVar50 - local_348.begin.
                                                                                    x) +
                                                               lVar60 + lVar28]) * 0.5;
                                }
                                else {
                                  lVar38 = (long)(int)(uVar58 - local_348.begin.x);
                                  dVar73 = 0.0;
                                }
                                uVar29 = uVar34 - 1;
                                uVar18 = uVar34;
                                if (*(int *)((long)local_2b0.p +
                                            lVar42 * 4 +
                                            (long)local_534 * local_2b0.jstride * 4 + lVar43) == 1)
                                {
                                  uVar18 = uVar29;
                                }
                                uVar40 = uVar34 + 1;
                                uVar25 = uVar34;
                                if (*(int *)((long)local_2b0.p +
                                            lVar42 * 4 +
                                            (long)iVar17 * local_2b0.jstride * 4 + lVar43) == 1) {
                                  uVar25 = uVar40;
                                }
                                dVar79 = 0.0;
                                dVar80 = 0.0;
                                if (uVar25 == uVar18 + 2) {
                                  dVar80 = (((double)local_348.p
                                                     [(int)(uVar40 - local_348.begin.y) *
                                                      local_348.jstride + lVar38 + lVar60 + lVar28]
                                            - (local_348.p[lVar27 + lVar38 + lVar60 + lVar28] +
                                              (double)local_348.p[lVar27 + lVar38 + lVar60 + lVar28]
                                              )) + (double)local_348.p
                                                           [(int)(uVar29 - local_348.begin.y) *
                                                            local_348.jstride +
                                                            lVar38 + lVar60 + lVar28]) * 0.5;
                                }
                                if (((local_2b0.p[lVar30 + lVar31 + lVar52] == 1) &&
                                    (local_2b0.p[lVar30 + lVar31 + lVar20] == 1)) &&
                                   ((local_2b0.p[lVar30 + lVar35 + lVar52] == 1 &&
                                    (local_2b0.p[lVar30 + lVar35 + lVar20] == 1)))) {
                                  lVar52 = (int)(uVar40 - local_348.begin.y) * local_348.jstride;
                                  lVar20 = (int)(uVar29 - local_348.begin.y) * local_348.jstride;
                                  dVar79 = ((((double)local_348.p
                                                      [lVar52 + (long)(int)(uVar59 - local_348.begin
                                                                                     .x) +
                                                                lVar60 + lVar28] -
                                             (double)local_348.p
                                                     [lVar52 + (long)(int)(uVar50 - local_348.begin.
                                                                                    x) +
                                                               lVar60 + lVar28]) +
                                            (double)local_348.p
                                                    [lVar20 + (long)(int)(uVar50 - local_348.begin.x
                                                                         ) + lVar60 + lVar28]) -
                                           (double)local_348.p
                                                   [lVar20 + (long)(int)(uVar59 - local_348.begin.x)
                                                             + lVar60 + lVar28]) * 0.25;
                                }
                                dVar81 = 1.0;
                                if (uVar25 != uVar18 + 1) {
                                  dVar81 = 0.5;
                                }
                                dVar82 = 1.0;
                                if (uVar69 != uVar62 + 1) {
                                  dVar82 = 0.5;
                                }
                                dVar74 = ((double)(int)(uVar58 * -uVar33 + uVar23 + iVar64) + 0.5) /
                                         (double)(int)uVar33 + -0.5;
                                dVar78 = ((double)(int)(uVar16 - uVar34 * iVar63) + 0.5) /
                                         (double)iVar63 + -0.5;
                                *(double *)(local_530 + lVar42 * 8) =
                                     dVar74 * dVar78 * dVar79 +
                                     dVar78 * dVar78 * dVar80 +
                                     ((double)local_348.p
                                              [(int)(uVar25 - local_348.begin.y) * local_348.jstride
                                               + lVar38 + lVar60 + lVar28] -
                                     (double)local_348.p
                                             [(int)(uVar18 - local_348.begin.y) * local_348.jstride
                                              + lVar38 + lVar60 + lVar28]) * dVar81 * dVar78 +
                                     dVar74 * dVar74 * dVar73 +
                                     ((double)local_348.p
                                              [lVar27 + (long)(int)(uVar69 - local_348.begin.x) +
                                                        lVar60 + lVar28] -
                                     (double)local_348.p
                                             [lVar27 + (long)(int)(uVar62 - local_348.begin.x) +
                                                       lVar60 + lVar28]) * dVar82 * dVar74 +
                                     (double)local_348.p[lVar27 + lVar38 + lVar60 + lVar28];
                                lVar42 = lVar42 + 1;
                                uVar57 = uVar57 - 1;
                              } while (~uVar39 + uVar23 + (int)lVar42 != 0);
                            }
                            uVar41 = uVar41 + 1;
                            local_530 = local_530 + local_308.jstride * 8;
                            local_534 = local_534 + 1;
                            iVar17 = iVar17 + 1;
                          } while (iVar3 + 1 != (int)uVar41);
                        }
                        bVar70 = uVar55 != uVar2;
                        uVar55 = uVar55 + 1;
                      } while (bVar70);
                    }
                    local_350 = local_350 + 1;
                    local_438 = local_438 + 8;
                  } while (local_350 != uVar19);
                }
              }
              else {
                local_4c0 = lVar1;
                if (uVar32 == 1) {
                  if (0 < num_comp) {
                    uVar32 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[2];
                    uVar2 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[2];
                    iVar3 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[1];
                    uVar23 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
                    uVar39 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[0];
                    iVar4 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[1];
                    uVar41 = (ulong)iVar4;
                    auVar13._4_8_ = extraout_XMM0_Qb;
                    auVar13._0_4_ = uVar72;
                    auVar76._0_8_ = (double)(int)uVar33;
                    auVar76._8_8_ = (double)(int)uVar72;
                    lVar46 = (long)(int)uVar23;
                    local_4c8 = 0;
                    do {
                      if ((int)uVar32 <= (int)uVar2) {
                        local_50c = uVar72 + uVar32;
                        uVar55 = uVar32;
                        do {
                          if (iVar4 <= iVar3) {
                            lVar28 = (int)(uVar55 - local_2b0.begin.z) * local_2b0.kstride;
                            lVar30 = (long)(int)((uVar55 - uVar72) - local_2b0.begin.z);
                            local_520 = (long)local_308.p +
                                        local_308.nstride * local_4c0 +
                                        (uVar41 - (long)local_308.begin.y) * local_308.jstride * 8 +
                                        ((long)(int)uVar55 - (long)local_308.begin.z) *
                                        local_308.kstride * 8 + (long)local_308.begin.x * -8 +
                                        lVar46 * 8;
                            lVar31 = local_2b0.kstride * lVar30;
                            lVar35 = (int)((uVar55 + uVar72) - local_2b0.begin.z) *
                                     local_2b0.kstride;
                            lVar43 = local_2b0.jstride * 4;
                            lVar26 = (uVar41 - (long)local_2b0.begin.y) * lVar43;
                            local_4b0 = (long)local_2b0.p +
                                        (long)(local_50c - local_2b0.begin.z) *
                                        local_2b0.kstride * 4 + lVar26 +
                                        (long)local_2b0.begin.x * -4 + lVar46 * 4;
                            local_528 = (long)local_2b0.p +
                                        local_2b0.kstride * 4 * lVar30 + lVar26 +
                                        (long)local_2b0.begin.x * -4 + lVar46 * 4;
                            lVar30 = local_348.nstride * (lVar37 + local_4c8);
                            uVar51 = uVar41;
                            do {
                              if ((int)uVar23 <= (int)uVar39) {
                                uVar16 = (uint)uVar51;
                                lVar26 = (uVar51 - (long)local_2b0.begin.y) * local_2b0.jstride;
                                lVar42 = 0;
                                uVar57 = ~uVar23;
                                do {
                                  lVar52 = lVar46 + lVar42;
                                  uVar67 = (ulong)uVar23 + lVar42;
                                  uVar58 = (uint)uVar67;
                                  if (uVar33 == 4) {
                                    if (lVar52 < 0) {
                                      uVar67 = (ulong)(uint)((int)uVar58 >> 2);
                                    }
                                    else {
                                      uVar67 = (ulong)(uVar58 >> 2);
                                    }
                                  }
                                  else if (uVar33 == 2) {
                                    if (lVar52 < 0) {
                                      uVar67 = (ulong)(uint)((int)uVar58 >> 1);
                                    }
                                    else {
                                      uVar67 = (ulong)(uVar58 >> 1);
                                    }
                                  }
                                  else if (uVar33 == 1) {
                                    uVar67 = uVar67 & 0xffffffff;
                                  }
                                  else if (lVar52 < 0) {
                                    uVar67 = (ulong)(uint)~((int)uVar57 / (int)uVar33);
                                  }
                                  else {
                                    uVar67 = (long)((ulong)(uint)((int)uVar58 >> 0x1f) << 0x20 |
                                                   uVar67 & 0xffffffff) / (long)(int)uVar33 &
                                             0xffffffff;
                                  }
                                  iVar17 = (int)uVar67;
                                  uVar34 = uVar16;
                                  if (((iVar63 != 1) && (uVar34 = (int)uVar16 >> 2, iVar63 != 4)) &&
                                     (uVar34 = (int)uVar16 >> 1, iVar63 != 2)) {
                                    if ((long)uVar51 < 0) {
                                      uVar34 = ~((int)~uVar16 / iVar63);
                                    }
                                    else {
                                      uVar34 = (uint)((long)((ulong)(uint)((int)uVar16 >> 0x1f) <<
                                                             0x20 | uVar51 & 0xffffffff) /
                                                     (long)iVar63);
                                    }
                                  }
                                  uVar56 = (ulong)uVar55;
                                  if (((uVar72 != 1) &&
                                      (uVar56 = (ulong)(uint)((int)uVar55 >> 2), uVar72 != 4)) &&
                                     (uVar56 = (ulong)(uint)((int)uVar55 >> 1), uVar72 != 2)) {
                                    if ((int)uVar55 < 0) {
                                      uVar56 = (ulong)(uint)~((int)~uVar55 / (int)uVar72);
                                    }
                                    else {
                                      uVar56 = (long)(int)uVar55 / (long)(int)uVar72 & 0xffffffff;
                                    }
                                  }
                                  iVar64 = (int)uVar56;
                                  lVar52 = (long)(int)((uVar23 - (uVar33 + local_2b0.begin.x)) +
                                                      (int)lVar42);
                                  iVar66 = iVar17 + -1;
                                  iVar61 = iVar17;
                                  if (local_2b0.p[lVar26 + lVar52 + lVar28] == 1) {
                                    iVar61 = iVar66;
                                  }
                                  lVar20 = (long)(int)(((uVar23 + uVar33) - local_2b0.begin.x) +
                                                      (int)lVar42);
                                  iVar68 = iVar17 + 1;
                                  iVar36 = iVar17;
                                  if (local_2b0.p[lVar26 + lVar20 + lVar28] == 1) {
                                    iVar36 = iVar68;
                                  }
                                  lVar27 = ((long)(int)uVar34 - (long)local_348.begin.y) *
                                           local_348.jstride;
                                  lVar60 = (iVar64 - local_348.begin.z) * local_348.kstride;
                                  if (iVar36 == iVar61 + 2) {
                                    lVar38 = (long)(iVar17 - local_348.begin.x);
                                    dVar73 = (((double)local_348.p
                                                       [lVar27 + (long)(iVar68 - local_348.begin.x)
                                                                 + lVar60 + lVar30] -
                                              (local_348.p[lVar27 + lVar38 + lVar60 + lVar30] +
                                              (double)local_348.p[lVar27 + lVar38 + lVar60 + lVar30]
                                              )) + (double)local_348.p
                                                           [lVar27 + (long)(iVar66 - local_348.begin
                                                                                     .x) +
                                                                     lVar60 + lVar30]) * 0.5;
                                  }
                                  else {
                                    lVar38 = (long)(iVar17 - local_348.begin.x);
                                    dVar73 = 0.0;
                                  }
                                  iVar48 = iVar64 + -1;
                                  iVar17 = iVar64;
                                  if (*(int *)(local_528 + lVar42 * 4) == 1) {
                                    iVar17 = iVar48;
                                  }
                                  iVar49 = iVar64 + 1;
                                  if (*(int *)(local_4b0 + lVar42 * 4) == 1) {
                                    iVar64 = iVar49;
                                  }
                                  dVar79 = 0.0;
                                  dVar80 = 0.0;
                                  if (iVar64 == iVar17 + 2) {
                                    dVar80 = (((double)local_348.p
                                                       [lVar27 + lVar38 + (iVar49 - local_348.begin.
                                                                                    z) *
                                                                          local_348.kstride + lVar30
                                                       ] -
                                              (local_348.p[lVar27 + lVar38 + lVar60 + lVar30] +
                                              (double)local_348.p[lVar27 + lVar38 + lVar60 + lVar30]
                                              )) + (double)local_348.p
                                                           [lVar27 + lVar38 + (iVar48 - local_348.
                                                                                        begin.z) *
                                                                              local_348.kstride +
                                                                              lVar30]) * 0.5;
                                  }
                                  if (((local_2b0.p[lVar26 + lVar52 + lVar31] == 1) &&
                                      (local_2b0.p[lVar26 + lVar20 + lVar31] == 1)) &&
                                     ((local_2b0.p[lVar26 + lVar52 + lVar35] == 1 &&
                                      (local_2b0.p[lVar26 + lVar20 + lVar35] == 1)))) {
                                    lVar52 = (iVar49 - local_348.begin.z) * local_348.kstride;
                                    lVar20 = (iVar48 - local_348.begin.z) * local_348.kstride;
                                    dVar79 = ((((double)local_348.p
                                                        [lVar27 + (long)(iVar68 - local_348.begin.x)
                                                                  + lVar52 + lVar30] -
                                               (double)local_348.p
                                                       [lVar27 + (long)(iVar66 - local_348.begin.x)
                                                                 + lVar52 + lVar30]) +
                                              (double)local_348.p
                                                      [lVar27 + (long)(iVar66 - local_348.begin.x) +
                                                                lVar20 + lVar30]) -
                                             (double)local_348.p
                                                     [lVar27 + (long)(iVar68 - local_348.begin.x) +
                                                               lVar20 + lVar30]) * 0.25;
                                  }
                                  dVar81 = 1.0;
                                  if (iVar64 != iVar17 + 1) {
                                    dVar81 = 0.5;
                                  }
                                  dVar82 = 1.0;
                                  if (iVar36 != iVar61 + 1) {
                                    dVar82 = 0.5;
                                  }
                                  auVar77._0_8_ =
                                       (double)(int)(uVar58 - (int)(uVar67 * uVar33)) + 0.5;
                                  auVar77._8_8_ =
                                       (double)(int)(uVar55 - (int)((auVar13._0_8_ & 0xffffffff) *
                                                                   uVar56)) + 0.5;
                                  auVar77 = divpd(auVar77,auVar76);
                                  dVar74 = auVar77._0_8_ + -0.5;
                                  dVar78 = auVar77._8_8_ + -0.5;
                                  *(double *)(local_520 + lVar42 * 8) =
                                       dVar74 * dVar78 * dVar79 +
                                       dVar78 * dVar78 * dVar80 +
                                       ((double)local_348.p
                                                [lVar27 + lVar38 + (iVar64 - local_348.begin.z) *
                                                                   local_348.kstride + lVar30] -
                                       (double)local_348.p
                                               [lVar27 + lVar38 + (iVar17 - local_348.begin.z) *
                                                                  local_348.kstride + lVar30]) *
                                       dVar81 * dVar78 +
                                       dVar74 * dVar74 * dVar73 +
                                       ((double)local_348.p
                                                [lVar27 + (long)(iVar36 - local_348.begin.x) +
                                                          lVar60 + lVar30] -
                                       (double)local_348.p
                                               [lVar27 + (long)(iVar61 - local_348.begin.x) +
                                                         lVar60 + lVar30]) * dVar82 * dVar74 +
                                       (double)local_348.p[lVar27 + lVar38 + lVar60 + lVar30];
                                  lVar42 = lVar42 + 1;
                                  uVar57 = uVar57 - 1;
                                } while (~uVar39 + uVar23 + (int)lVar42 != 0);
                              }
                              uVar51 = uVar51 + 1;
                              local_520 = local_520 + local_308.jstride * 8;
                              local_4b0 = local_4b0 + lVar43;
                              local_528 = local_528 + lVar43;
                            } while (iVar3 + 1 != (int)uVar51);
                          }
                          local_50c = local_50c + 1;
                          bVar70 = uVar55 != uVar2;
                          uVar55 = uVar55 + 1;
                        } while (bVar70);
                      }
                      local_4c8 = local_4c8 + 1;
                      local_4c0 = local_4c0 + 8;
                    } while (local_4c8 != uVar19);
                  }
                }
                else if ((uVar32 == 0) && (0 < num_comp)) {
                  uVar32 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[2];
                  uVar2 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[2];
                  iVar3 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[1];
                  uVar23 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
                  uVar39 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[0];
                  iVar4 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[1];
                  uVar51 = (ulong)iVar4;
                  auVar71._0_8_ = (double)iVar63;
                  auVar71._8_8_ = (double)(int)uVar72;
                  lVar46 = (long)(int)uVar23;
                  local_4c8 = 0;
                  do {
                    if ((int)uVar32 <= (int)uVar2) {
                      local_50c = uVar32 + uVar72;
                      uVar55 = uVar32;
                      do {
                        if (iVar4 <= iVar3) {
                          lVar26 = (long)local_2b0.begin.x;
                          local_4f8 = (long)local_308.p +
                                      local_308.nstride * local_4c0 +
                                      (uVar51 - (long)local_308.begin.y) * local_308.jstride * 8 +
                                      ((long)(int)uVar55 - (long)local_308.begin.z) *
                                      local_308.kstride * 8 + (long)local_308.begin.x * -8 +
                                      lVar46 * 8;
                          lVar30 = local_2b0.kstride * 4;
                          local_4e4 = iVar4 - (local_2b0.begin.y + iVar63);
                          lVar52 = (local_50c - local_2b0.begin.z) * lVar30;
                          lVar42 = (int)(uVar55 - (uVar72 + local_2b0.begin.z)) * lVar30;
                          local_534 = (iVar63 + iVar4) - local_2b0.begin.y;
                          lVar35 = local_2b0.jstride * 4;
                          lVar31 = (uVar51 - (long)local_2b0.begin.y) * lVar35;
                          lVar43 = lVar52 + lVar26 * -4 + lVar46 * 4;
                          lVar28 = lVar42 + lVar26 * -4 + lVar46 * 4;
                          lVar30 = ((long)(int)uVar55 - (long)local_2b0.begin.z) * lVar30 +
                                   lVar26 * -4 + lVar46 * 4;
                          local_530 = (long)local_2b0.p + lVar52 + lVar31 + lVar26 * -4 + lVar46 * 4
                          ;
                          local_548 = (long)local_2b0.p + lVar31 + lVar42 + lVar26 * -4 + lVar46 * 4
                          ;
                          lVar26 = local_348.nstride * (lVar37 + local_4c8);
                          uVar67 = uVar51;
                          do {
                            if ((int)uVar23 <= (int)uVar39) {
                              lVar42 = local_4e4 * lVar35;
                              lVar52 = local_534 * lVar35;
                              uVar16 = (uint)uVar67;
                              lVar31 = 0;
                              uVar57 = ~uVar23;
                              do {
                                lVar20 = lVar46 + lVar31;
                                uVar58 = (uint)((ulong)uVar23 + lVar31);
                                if (uVar33 == 4) {
                                  if (lVar20 < 0) {
                                    uVar58 = (int)uVar58 >> 2;
                                  }
                                  else {
                                    uVar58 = uVar58 >> 2;
                                  }
                                }
                                else if (uVar33 == 2) {
                                  if (lVar20 < 0) {
                                    uVar58 = (int)uVar58 >> 1;
                                  }
                                  else {
                                    uVar58 = uVar58 >> 1;
                                  }
                                }
                                else if (uVar33 != 1) {
                                  if (lVar20 < 0) {
                                    uVar58 = ~((int)uVar57 / (int)uVar33);
                                  }
                                  else {
                                    uVar58 = (uint)((long)((ulong)(uint)((int)uVar58 >> 0x1f) <<
                                                           0x20 | (ulong)uVar23 + lVar31 &
                                                                  0xffffffff) / (long)(int)uVar33);
                                  }
                                }
                                uVar56 = uVar67 & 0xffffffff;
                                if (((iVar63 != 1) &&
                                    (uVar56 = (ulong)(uint)((int)uVar16 >> 2), iVar63 != 4)) &&
                                   (uVar56 = (ulong)(uint)((int)uVar16 >> 1), iVar63 != 2)) {
                                  if ((long)uVar67 < 0) {
                                    uVar56 = (ulong)(uint)~((int)~uVar16 / iVar63);
                                  }
                                  else {
                                    uVar56 = (long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 |
                                                   uVar67 & 0xffffffff) / (long)iVar63 & 0xffffffff;
                                  }
                                }
                                iVar17 = (int)uVar56;
                                uVar47 = (ulong)uVar55;
                                if (((uVar72 != 1) &&
                                    (uVar47 = (ulong)(uint)((int)uVar55 >> 2), uVar72 != 4)) &&
                                   (uVar47 = (ulong)(uint)((int)uVar55 >> 1), uVar72 != 2)) {
                                  if ((int)uVar55 < 0) {
                                    uVar47 = (ulong)(uint)~((int)~uVar55 / (int)uVar72);
                                  }
                                  else {
                                    uVar47 = (long)(int)uVar55 / (long)(int)uVar72 & 0xffffffff;
                                  }
                                }
                                iVar64 = (int)uVar47;
                                iVar66 = iVar17 + -1;
                                iVar61 = iVar17;
                                if (*(int *)((long)local_2b0.p + lVar31 * 4 + lVar42 + lVar30) == 1)
                                {
                                  iVar61 = iVar66;
                                }
                                iVar68 = iVar17 + 1;
                                iVar36 = iVar17;
                                if (*(int *)((long)local_2b0.p + lVar31 * 4 + lVar52 + lVar30) == 1)
                                {
                                  iVar36 = iVar68;
                                }
                                lVar60 = (long)(int)uVar58 - (long)local_348.begin.x;
                                lVar20 = (iVar64 - local_348.begin.z) * local_348.kstride;
                                if (iVar36 == iVar61 + 2) {
                                  lVar27 = (iVar17 - local_348.begin.y) * local_348.jstride;
                                  dVar73 = (((double)local_348.p
                                                     [(iVar68 - local_348.begin.y) *
                                                      local_348.jstride + lVar60 + lVar20 + lVar26]
                                            - (local_348.p[lVar27 + lVar60 + lVar20 + lVar26] +
                                              (double)local_348.p[lVar27 + lVar60 + lVar20 + lVar26]
                                              )) + (double)local_348.p
                                                           [(iVar66 - local_348.begin.y) *
                                                            local_348.jstride +
                                                            lVar60 + lVar20 + lVar26]) * 0.5;
                                }
                                else {
                                  lVar27 = (iVar17 - local_348.begin.y) * local_348.jstride;
                                  dVar73 = 0.0;
                                }
                                iVar48 = iVar64 + -1;
                                iVar17 = iVar64;
                                if (*(int *)(local_548 + lVar31 * 4) == 1) {
                                  iVar17 = iVar48;
                                }
                                iVar49 = iVar64 + 1;
                                if (*(int *)(local_530 + lVar31 * 4) == 1) {
                                  iVar64 = iVar49;
                                }
                                dVar80 = 0.0;
                                dVar79 = 0.0;
                                if (iVar64 == iVar17 + 2) {
                                  dVar79 = (((double)local_348.p
                                                     [lVar27 + lVar60 + (iVar49 - local_348.begin.z)
                                                                        * local_348.kstride + lVar26
                                                     ] -
                                            (local_348.p[lVar27 + lVar60 + lVar20 + lVar26] +
                                            (double)local_348.p[lVar27 + lVar60 + lVar20 + lVar26]))
                                           + (double)local_348.p
                                                     [lVar27 + lVar60 + (iVar48 - local_348.begin.z)
                                                                        * local_348.kstride + lVar26
                                                     ]) * 0.5;
                                }
                                if (((*(int *)((long)local_2b0.p + lVar31 * 4 + lVar42 + lVar28) ==
                                      1) && (*(int *)((long)local_2b0.p +
                                                     lVar31 * 4 + lVar52 + lVar28) == 1)) &&
                                   ((*(int *)((long)local_2b0.p + lVar31 * 4 + lVar42 + lVar43) == 1
                                    && (*(int *)((long)local_2b0.p + lVar31 * 4 + lVar52 + lVar43)
                                        == 1)))) {
                                  lVar38 = (iVar68 - local_348.begin.y) * local_348.jstride;
                                  lVar53 = (iVar49 - local_348.begin.z) * local_348.kstride;
                                  lVar65 = (iVar66 - local_348.begin.y) * local_348.jstride;
                                  lVar54 = (iVar48 - local_348.begin.z) * local_348.kstride;
                                  dVar80 = ((((double)local_348.p[lVar38 + lVar60 + lVar53 + lVar26]
                                             - (double)local_348.p
                                                       [lVar65 + lVar60 + lVar53 + lVar26]) +
                                            (double)local_348.p[lVar65 + lVar60 + lVar54 + lVar26])
                                           - (double)local_348.p[lVar38 + lVar60 + lVar54 + lVar26])
                                           * 0.25;
                                }
                                dVar81 = 1.0;
                                if (iVar64 != iVar17 + 1) {
                                  dVar81 = 0.5;
                                }
                                dVar82 = 1.0;
                                if (iVar36 != iVar61 + 1) {
                                  dVar82 = 0.5;
                                }
                                auVar75._0_8_ =
                                     (double)(int)(uVar16 - (int)(uVar56 * (uVar41 & 0xffffffff))) +
                                     0.5;
                                auVar75._8_8_ = (double)(int)(uVar55 - (int)(uVar72 * uVar47)) + 0.5
                                ;
                                auVar76 = divpd(auVar75,auVar71);
                                dVar74 = auVar76._0_8_ + -0.5;
                                dVar78 = auVar76._8_8_ + -0.5;
                                *(double *)(local_4f8 + lVar31 * 8) =
                                     dVar74 * dVar78 * dVar80 +
                                     dVar78 * dVar78 * dVar79 +
                                     ((double)local_348.p
                                              [lVar27 + lVar60 + (iVar64 - local_348.begin.z) *
                                                                 local_348.kstride + lVar26] -
                                     (double)local_348.p
                                             [lVar27 + lVar60 + (iVar17 - local_348.begin.z) *
                                                                local_348.kstride + lVar26]) *
                                     dVar81 * dVar78 +
                                     dVar74 * dVar74 * dVar73 +
                                     ((double)local_348.p
                                              [(iVar36 - local_348.begin.y) * local_348.jstride +
                                               lVar60 + lVar20 + lVar26] -
                                     (double)local_348.p
                                             [(iVar61 - local_348.begin.y) * local_348.jstride +
                                              lVar60 + lVar20 + lVar26]) * dVar82 * dVar74 +
                                     (double)local_348.p[lVar27 + lVar60 + lVar20 + lVar26];
                                lVar31 = lVar31 + 1;
                                uVar57 = uVar57 - 1;
                              } while (~uVar39 + uVar23 + (int)lVar31 != 0);
                            }
                            uVar67 = uVar67 + 1;
                            local_4f8 = local_4f8 + local_308.jstride * 8;
                            local_4e4 = local_4e4 + 1;
                            local_534 = local_534 + 1;
                            local_530 = local_530 + lVar35;
                            local_548 = local_548 + lVar35;
                          } while (iVar3 + 1 != (int)uVar67);
                        }
                        local_50c = local_50c + 1;
                        bVar70 = uVar55 != uVar2;
                        uVar55 = uVar55 + 1;
                      } while (bVar70);
                    }
                    local_4c8 = local_4c8 + 1;
                    local_4c0 = local_4c0 + 8;
                  } while (local_4c8 != uVar19);
                }
              }
            }
          }
          uVar44 = uVar44 + 1;
        } while (uVar44 != 6);
        MFIter::operator++((MFIter *)local_248);
      } while ((int)local_238.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage < local_220);
    }
    MFIter::~MFIter((MFIter *)local_248);
    MultiFab::~MultiFab(&local_1b0);
    return;
  }
  Abort_host("InterpBndryData::setBndryValues supports only max_order=1 or 3");
  return;
}

Assistant:

void
InterpBndryData::BndryValuesDoIt (BndryRegister&  crse,
                                  int             c_start,
                                  const MultiFab* fine,
                                  int             f_start,
                                  int             bnd_start,
                                  int             num_comp,
                                  const IntVect&  ratio,
                                  const BCRec*    bc,
                                  int             max_order)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(fine == nullptr || grids == fine->boxArray());
    //
    // Set bndry types and bclocs.
    //
    if (bc != nullptr) {
        for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
            setBndryConds(*bc, ratio, n);
        }
    }
    //
    // First interpolate from coarse to fine on bndry.
    //
    const Box& fine_domain = geom.Domain();

    //
    // Mask turned off if covered by fine grid.
    //
    if (max_order==3 || max_order==1)
    {
        MultiFab foo(grids,bndry[0].DistributionMap(), 1, 0, MFInfo().SetAlloc(false), FArrayBoxFactory());

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(foo,info); mfi.isValid(); ++mfi)
        {
            BL_ASSERT(grids[mfi.index()] == mfi.validbox());

            const Box& fine_bx  = mfi.validbox();

            for (int i = 0; i < 2*AMREX_SPACEDIM; i++)
            {
                const int               dir  = ((i<AMREX_SPACEDIM) ? i : (i-AMREX_SPACEDIM));
                const Orientation::Side side = ((i<AMREX_SPACEDIM) ? Orientation::low : Orientation::high);

                const Orientation face(dir,side);

                if (fine_bx[face] != fine_domain[face] || geom.isPeriodic(dir))
                {
                    auto const crse_array = crse[face].array(mfi);
                    auto       bdry_array = bndry[face].array(mfi);
                    Box const& b = bndry[face][mfi].box();
                    const auto rr = ratio.dim3();
                    //
                    // Internal or periodic edge, interpolate from crse data.
                    //
                    if (max_order == 1)
                    {
                        AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                        {
                            interpbndrydata_o1(it,jt,kt,n,bdry_array,bnd_start,
                                               crse_array,c_start,rr);
                        });
                    }
                    else
                    {
                        auto const mask_array = masks[face].array(mfi);
                        int is_not_covered = BndryData::not_covered;
                        switch (dir) {
                        case 0:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_x_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM >= 2)
                        case 1:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_y_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#if (AMREX_SPACEDIM == 3)
                        case 2:
                        {
                            AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, it, jt, kt, n,
                            {
                                interpbndrydata_z_o3(it,jt,kt,n,bdry_array,bnd_start,
                                                     crse_array,c_start,rr,
                                                     mask_array, is_not_covered);
                            });
                            break;
                        }
#endif
#endif
                        default: {}
                        }
                    }
                }
                else if (fine != nullptr)
                {
                    //
                    // Physical bndry, copy from ghost region of corresponding grid
                    //
                    auto& bnd_fab = bndry[face][mfi];
                    auto const& src_fab = (*fine)[mfi];
                    auto bnd_array = bnd_fab.array();
                    auto const src_array = src_fab.array();
                    const Box& b = bnd_fab.box() & src_fab.box();
                    AMREX_HOST_DEVICE_FOR_4D ( b, num_comp, ii, jj, kk, nn,
                    {
                        bnd_array(ii,jj,kk,nn+bnd_start) = src_array(ii,jj,kk,nn+f_start);
                    });
                }
            }
        }
    }
    else
    {
        amrex::Abort("InterpBndryData::setBndryValues supports only max_order=1 or 3");
    }
}